

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

MemberSyntax * __thiscall slang::parsing::Parser::parseSpecifyItem(Parser *this)

{
  TokenKind TVar1;
  SpecparamDeclarationSyntax *pSVar2;
  PulseStyleDeclarationSyntax *pPVar3;
  ExpressionSyntax *predicate;
  ConditionalPathDeclarationSyntax *pCVar4;
  PathDeclarationSyntax *pPVar5;
  Diagnostic *this_00;
  IfNonePathDeclarationSyntax *pIVar6;
  SystemTimingCheckSyntax *pSVar7;
  Token TVar8;
  Token TVar9;
  Token closeParen;
  Token keyword_00;
  SourceRange SVar10;
  Token keyword;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_68;
  
  TVar8 = ParserBase::peek(&this->super_ParserBase);
  TVar1 = TVar8.kind;
  if (1 < TVar1 - 0xf6) {
    if (TVar1 == SystemIdentifier) {
      pSVar7 = parseSystemTimingCheck(this);
      return &pSVar7->super_MemberSyntax;
    }
    if (TVar1 == OpenParenthesis) {
      pPVar5 = parsePathDeclaration(this);
      return &pPVar5->super_MemberSyntax;
    }
    if (TVar1 == IfKeyword) {
      TVar8 = ParserBase::consume(&this->super_ParserBase);
      TVar9 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
      predicate = parseExpression(this);
      closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      pPVar5 = parsePathDeclaration(this);
      local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
      local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_68.super_SyntaxListBase.childCount = 0;
      local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
           (pointer)0x0;
      local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
      _M_extent._M_extent_value = 0;
      local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002da628;
      pCVar4 = syntax::SyntaxFactory::conditionalPathDeclaration
                         (&this->factory,&local_68,TVar8,TVar9,predicate,closeParen,pPVar5);
      return &pCVar4->super_MemberSyntax;
    }
    if (TVar1 == IfNoneKeyword) {
      keyword_00 = ParserBase::consume(&this->super_ParserBase);
      keyword = keyword_00;
      pPVar5 = parsePathDeclaration(this);
      if ((((((pPVar5->desc).ptr)->suffix).ptr)->super_SyntaxNode).kind == EdgeSensitivePathSuffix)
      {
        SVar10 = Token::range(&keyword);
        this_00 = ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x5e0005,SVar10);
        SVar10 = syntax::SyntaxNode::sourceRange
                           (&((((pPVar5->desc).ptr)->suffix).ptr)->super_SyntaxNode);
        Diagnostic::operator<<(this_00,SVar10);
        keyword_00 = keyword;
      }
      local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
      local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.
      _M_extent._M_extent_value = 0;
      local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
      local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
      local_68.super_SyntaxListBase.childCount = 0;
      local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
           (pointer)0x0;
      local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002da628;
      pIVar6 = syntax::SyntaxFactory::ifNonePathDeclaration
                         (&this->factory,&local_68,keyword_00,pPVar5);
      return &pIVar6->super_MemberSyntax;
    }
    if ((TVar1 != NoShowCancelledKeyword) && (TVar1 != ShowCancelledKeyword)) {
      if (TVar1 != SpecParamKeyword) {
        return (MemberSyntax *)0x0;
      }
      pSVar2 = parseSpecparam(this,(AttrList)ZEXT816(0),SpecifyBlock);
      return &pSVar2->super_MemberSyntax;
    }
  }
  TVar8 = ParserBase::consume(&this->super_ParserBase);
  parsePathTerminals(this);
  local_68.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = 0;
  local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  local_68.super_SyntaxListBase.childCount = 0;
  local_68.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (pointer)0x0;
  local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002da628;
  keyword.info._0_4_ = 3;
  keyword._0_8_ = &PTR_getChild_002da9e0;
  TVar9 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  pPVar3 = syntax::SyntaxFactory::pulseStyleDeclaration
                     (&this->factory,&local_68,TVar8,
                      (SeparatedSyntaxList<slang::syntax::NameSyntax> *)&keyword,TVar9);
  return &pPVar3->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseSpecifyItem() {
    switch (peek().kind) {
        case TokenKind::SpecParamKeyword:
            return &parseSpecparam({}, SyntaxKind::SpecifyBlock);
        case TokenKind::PulseStyleOnDetectKeyword:
        case TokenKind::PulseStyleOnEventKeyword:
        case TokenKind::ShowCancelledKeyword:
        case TokenKind::NoShowCancelledKeyword: {
            auto keyword = consume();
            auto names = parsePathTerminals();
            return &factory.pulseStyleDeclaration(nullptr, keyword, names,
                                                  expect(TokenKind::Semicolon));
        }
        case TokenKind::OpenParenthesis:
            return &parsePathDeclaration();
        case TokenKind::IfNoneKeyword: {
            auto keyword = consume();
            auto& path = parsePathDeclaration();
            if (path.desc->suffix->kind == SyntaxKind::EdgeSensitivePathSuffix) {
                addDiag(diag::IfNoneEdgeSensitive, keyword.range())
                    << path.desc->suffix->sourceRange();
            }

            return &factory.ifNonePathDeclaration(nullptr, keyword, path);
        }
        case TokenKind::IfKeyword: {
            auto keyword = consume();
            auto openParen = expect(TokenKind::OpenParenthesis);
            auto& pred = parseExpression();
            auto closeParen = expect(TokenKind::CloseParenthesis);
            auto& path = parsePathDeclaration();
            return &factory.conditionalPathDeclaration(nullptr, keyword, openParen, pred,
                                                       closeParen, path);
        }
        case TokenKind::SystemIdentifier:
            return &parseSystemTimingCheck();
        default:
            // Otherwise, we got nothing and should just return null so that our caller
            // will skip and try again.
            return nullptr;
    }
}